

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int getLargestRec(int match,int *ids,int sx,int sz,Pos *p0,Pos *p1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  int *piVar4;
  undefined8 *puVar5;
  int in_ECX;
  int iVar6;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  int *in_R8;
  int *in_R9;
  int area;
  entry_t e;
  int n;
  int ret;
  int m;
  int w;
  int j;
  int i;
  entry_t *meta;
  int local_5c;
  int iStack_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_5c = in_ECX;
  if (in_ECX < in_EDX) {
    local_5c = in_EDX;
  }
  __ptr = calloc((long)local_5c,0xc);
  local_40 = 0;
  local_44 = 0;
  for (local_34 = in_EDX + -1; -1 < local_34; local_34 = local_34 + -1) {
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      if (*(int *)(in_RSI + (long)(local_38 * in_EDX + local_34) * 4) == in_EDI) {
        piVar4 = (int *)((long)__ptr + (long)local_38 * 0xc);
        *piVar4 = *piVar4 + 1;
      }
      else {
        *(undefined4 *)((long)__ptr + (long)local_38 * 0xc) = 0;
      }
    }
    local_3c = 0;
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      iVar1 = *(int *)((long)__ptr + (long)local_38 * 0xc);
      if (local_3c < iVar1) {
        *(int *)((long)__ptr + (long)local_40 * 0xc + 4) = local_38;
        *(int *)((long)__ptr + (long)local_40 * 0xc + 8) = local_3c;
        local_40 = local_40 + 1;
        local_3c = iVar1;
      }
      iVar6 = local_40;
      if (iVar1 != local_3c) {
        do {
          local_40 = iVar6;
          iVar6 = local_40 + -1;
          puVar5 = (undefined8 *)((long)__ptr + (long)iVar6 * 0xc);
          iVar2 = *(int *)(puVar5 + 1);
          iStack_50 = (int)((ulong)*puVar5 >> 0x20);
          iVar3 = local_3c * (local_38 - iStack_50);
          if (local_44 < iVar3) {
            *in_R8 = local_34;
            in_R8[1] = iStack_50;
            *in_R9 = local_34 + local_3c + -1;
            in_R9[1] = local_38 + -1;
            local_44 = iVar3;
          }
          local_3c = iVar2;
        } while (iVar1 < iVar2);
        local_3c = iVar1;
        if (iVar1 != 0) {
          iVar6 = local_40;
        }
      }
      local_40 = iVar6;
    }
  }
  free(__ptr);
  return local_44;
}

Assistant:

int getLargestRec(int match, const int *ids, int sx, int sz, Pos *p0, Pos *p1)
{
    typedef struct { int n, j, w; } entry_t;
    entry_t *meta = (entry_t*) calloc(sx > sz ? sx : sz, sizeof(*meta));
    int i, j, w, m, ret;
    ret = m = 0;

    for (i = sx-1; i >= 0; i--)
    {
        for (j = 0; j < sz; j++)
        {
            if (ids[j*sx + i] == match)
                meta[j].n++;
            else
                meta[j].n = 0;
        }
        for (w = j = 0; j < sz; j++)
        {
            int n = meta[j].n;
            if (n > w)
            {
                meta[m].j = j;
                meta[m].w = w;
                m++;
                w = n;
            }
            if (n == w)
                continue;
            do
            {
                entry_t e = meta[--m];
                int area = w * (j - e.j);
                if (area > ret)
                {
                    p0->x = i; p0->z = e.j;
                    p1->x = i+w-1; p1->z = j-1;
                    ret = area;
                }
                w = e.w;
            }
            while (n < w);
            if ((w = n))
                m++;
        }
    }
    free(meta);
    return ret;
}